

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmq.c
# Opt level: O0

void nmq_update(NMQ *q,uint32_t current)

{
  uint local_18;
  int32_t df;
  uint32_t current_local;
  NMQ *q_local;
  
  if (q->inited == '\x01') {
    local_18 = current - q->current;
    if ((10000 < (int)local_18) || ((int)local_18 < 0)) {
      local_18 = (uint)q->flush_interval;
    }
    if ((int)(uint)q->flush_interval <= (int)local_18) {
      q->current = current;
      flush(q);
    }
    return;
  }
  __assert_fail("q->inited == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iceonsun[P]nmq/nmq.c",0x12a,
                "void nmq_update(NMQ *, uint32_t)");
}

Assistant:

void nmq_update(NMQ *q, uint32_t current) {
    assert(q->inited == 1);

    int32_t df = current - q->current;  // df cannot < 0
    if (df > 10000 || df < 0) {
        df = q->flush_interval;
    }
    if (df >= q->flush_interval) {
        q->current = current;
        flush(q);
    }
}